

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QLabel::setTextInteractionFlags(QLabel *this,TextInteractionFlags flags)

{
  QLabelPrivate *this_00;
  bool bVar1;
  FocusPolicy policy;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if ((QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
      (this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i !=
      (QFlagsStorage<Qt::TextInteractionFlag>)
      flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i) {
    (this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
    super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (Int)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
              super_QFlagsStorage<Qt::TextInteractionFlag>.i;
    policy = StrongFocus;
    if (((uint)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 8) == 0) {
      policy = (uint)(((uint)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 3) != 0) * 2;
    }
    QWidget::setFocusPolicy((QWidget *)this,policy);
    bVar1 = QLabelPrivate::needTextControl(this_00);
    if (bVar1) {
      QLabelPrivate::ensureTextControl(this_00);
      if ((QWidgetTextControl *)this_00->control != (QWidgetTextControl *)0x0) {
        QWidgetTextControl::setTextInteractionFlags
                  ((QWidgetTextControl *)this_00->control,
                   (TextInteractionFlags)
                   (this_00->textInteractionFlags).
                   super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                   super_QFlagsStorage<Qt::TextInteractionFlag>.i);
        return;
      }
    }
    else {
      if (this_00->control != (QWidgetTextControl *)0x0) {
        (**(code **)(*(long *)this_00->control + 0x20))();
      }
      this_00->control = (QWidgetTextControl *)0x0;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }